

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

unique_lock<pstore::file::range_lock> * __thiscall
pstore::database::upgrade_to_write_lock(database *this)

{
  file_base *file;
  unique_lock<pstore::file::range_lock> local_40;
  range_lock local_30;
  database *local_10;
  database *this_local;
  
  local_10 = this;
  std::unique_lock<pstore::file::range_lock>::unlock(&this->lock_);
  std::unique_lock<pstore::file::range_lock>::release(&this->lock_);
  file = database::file(this);
  anon_unknown.dwarf_62c35d::get_vacuum_range_lock(&local_30,file,exclusive_write);
  pstore::file::range_lock::operator=(&this->range_lock_,&local_30);
  pstore::file::range_lock::~range_lock(&local_30);
  std::unique_lock<pstore::file::range_lock>::unique_lock(&local_40,&this->range_lock_);
  std::unique_lock<pstore::file::range_lock>::operator=(&this->lock_,&local_40);
  std::unique_lock<pstore::file::range_lock>::~unique_lock(&local_40);
  return &this->lock_;
}

Assistant:

std::unique_lock<file::range_lock> * database::upgrade_to_write_lock () {
        // TODO: look at exception-safety in this function.
        lock_.unlock ();
        lock_.release ();
        range_lock_ =
            get_vacuum_range_lock (this->file (), file::file_handle::lock_kind::exclusive_write);
        lock_ = std::unique_lock<file::range_lock> (range_lock_, std::defer_lock);
        return &lock_;
    }